

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O3

Promise<int> __thiscall kj::anon_unknown_0::identity<int>(anon_unknown_0 *this,int *value)

{
  Coroutine<int> *this_00;
  SourceLocation location;
  coroutine_handle<void> coroutine;
  
  coroutine._M_fr_ptr = operator_new(0x240);
  *(code **)coroutine._M_fr_ptr = identity<int>;
  *(code **)((long)coroutine._M_fr_ptr + 8) = identity<int>;
  this_00 = (Coroutine<int> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00605488;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006054d0;
  location.function = "identity";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x20;
  location.columnNumber = 0x17;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00605488;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006054d0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  *(Coroutine<int> **)this = this_00;
  *(int *)((long)coroutine._M_fr_ptr + 0x238) = *value;
  kj::_::Coroutine<int>::fulfill(this_00,(FixVoid<int> *)((long)coroutine._M_fr_ptr + 0x238));
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x23c) = 0;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<kj::Decay<T>> identity(T&& value) {
  co_return kj::fwd<T>(value);
}